

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O2

void __thiscall
google::protobuf::util::DefaultFieldComparator::SetFractionAndMargin
          (DefaultFieldComparator *this,FieldDescriptor *field,double fraction,double margin)

{
  CppType CVar1;
  LogMessage *pLVar2;
  mapped_type *pmVar3;
  LogMessage local_78;
  FieldDescriptor *local_40;
  FieldDescriptor *field_local;
  double local_30;
  LogFinisher local_21;
  
  local_40 = field;
  field_local = (FieldDescriptor *)margin;
  local_30 = fraction;
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 != CPPTYPE_FLOAT) {
    CVar1 = FieldDescriptor::cpp_type(field);
    if (CVar1 != CPPTYPE_DOUBLE) {
      protobuf::internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/field_comparator.cc"
                 ,0x94);
      pLVar2 = protobuf::internal::LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: FieldDescriptor::CPPTYPE_FLOAT == field->cpp_type() || FieldDescriptor::CPPTYPE_DOUBLE == field->cpp_type(): "
                         );
      pLVar2 = protobuf::internal::LogMessage::operator<<
                         (pLVar2,"Field has to be float or double type. Field name is: ");
      pLVar2 = protobuf::internal::LogMessage::operator<<(pLVar2,*(string **)(field + 8));
      protobuf::internal::LogFinisher::operator=(&local_21,pLVar2);
      protobuf::internal::LogMessage::~LogMessage(&local_78);
    }
  }
  pmVar3 = std::
           map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::DefaultFieldComparator::Tolerance,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::DefaultFieldComparator::Tolerance>_>_>
           ::operator[](&this->map_tolerance_,&local_40);
  pmVar3->fraction = local_30;
  pmVar3->margin = (double)field_local;
  return;
}

Assistant:

void DefaultFieldComparator::SetFractionAndMargin(const FieldDescriptor* field,
                                                  double fraction,
                                                  double margin) {
  GOOGLE_CHECK(FieldDescriptor::CPPTYPE_FLOAT == field->cpp_type() ||
        FieldDescriptor::CPPTYPE_DOUBLE == field->cpp_type())
      << "Field has to be float or double type. Field name is: "
      << field->full_name();
  map_tolerance_[field] = Tolerance(fraction, margin);
}